

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

void __thiscall
t_js_generator::generate_serialize_container
          (t_js_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  t_js_generator *this_00;
  string kiter;
  string viter;
  string sStack_178;
  allocator local_151;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "output.writeSetBegin(";
      poVar3 = std::operator<<(poVar3,"output.writeSetBegin(");
      type_to_enum_abi_cxx11_
                (&sStack_178,(t_js_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,".length);");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_00234a89;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "output.writeListBegin(";
      poVar3 = std::operator<<(poVar3,"output.writeListBegin(");
      type_to_enum_abi_cxx11_
                (&sStack_178,(t_js_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,".length);");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_00234a89;
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    pcVar4 = "output.writeMapBegin(";
    poVar3 = std::operator<<(poVar3,"output.writeMapBegin(");
    type_to_enum_abi_cxx11_
              (&sStack_178,(t_js_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
    this_00 = (t_js_generator *)0x2fdaef;
    poVar3 = std::operator<<(poVar3,", ");
    type_to_enum_abi_cxx11_(&local_150,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar3 = std::operator<<(poVar3,(string *)&local_150);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"Thrift.objectLength(");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,"));");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_150);
LAB_00234a89:
    std::__cxx11::string::~string((string *)&sStack_178);
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') goto LAB_00235086;
      std::__cxx11::string::string((string *)&local_110,"iter",(allocator *)&local_150);
      t_generator::tmp(&sStack_178,(t_generator *)this,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"for (");
      poVar3 = std::operator<<(poVar3,(string *)&this->js_let_type_);
      poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
      poVar3 = std::operator<<(poVar3," in ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,") {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"if (");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,".hasOwnProperty(");
      poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
      poVar3 = std::operator<<(poVar3,")) {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
      poVar3 = std::operator<<(poVar3,"];");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_130,(string *)&sStack_178);
      generate_serialize_list_element(this,out,(t_list *)ttype,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    }
    else {
      std::__cxx11::string::string((string *)&local_d0,"iter",(allocator *)&local_150);
      t_generator::tmp(&sStack_178,(t_generator *)this,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"for (");
      poVar3 = std::operator<<(poVar3,(string *)&this->js_let_type_);
      poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
      poVar3 = std::operator<<(poVar3," in ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,") {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"if (");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,".hasOwnProperty(");
      poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
      poVar3 = std::operator<<(poVar3,")) {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
      poVar3 = std::operator<<(poVar3,"];");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_f0,(string *)&sStack_178);
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"kiter",(allocator *)&local_150);
    t_generator::tmp(&sStack_178,(t_generator *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,"viter",&local_151);
    t_generator::tmp(&local_150,(t_generator *)this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"for (");
    poVar3 = std::operator<<(poVar3,(string *)&this->js_let_type_);
    poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,") {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"if (");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,".hasOwnProperty(");
    poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
    poVar3 = std::operator<<(poVar3,")) {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,(string *)&this->js_let_type_);
    poVar3 = std::operator<<(poVar3,(string *)&local_150);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&sStack_178);
    poVar3 = std::operator<<(poVar3,"];");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::string((string *)&local_90,(string *)&sStack_178);
    std::__cxx11::string::string((string *)&local_b0,(string *)&local_150);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::__cxx11::string::~string((string *)&local_150);
  }
  std::__cxx11::string::~string((string *)&sStack_178);
LAB_00235086:
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') {
        return;
      }
      pcVar4 = "output.writeListEnd();";
    }
    else {
      pcVar4 = "output.writeSetEnd();";
    }
  }
  else {
    pcVar4 = "output.writeMapEnd();";
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_js_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  if (ttype->is_map()) {
    indent(out) << "output.writeMapBegin(" << type_to_enum(((t_map*)ttype)->get_key_type()) << ", "
                << type_to_enum(((t_map*)ttype)->get_val_type()) << ", "
                << "Thrift.objectLength(" << prefix << "));" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "output.writeSetBegin(" << type_to_enum(((t_set*)ttype)->get_elem_type()) << ", "
                << prefix << ".length);" << endl;

  } else if (ttype->is_list()) {

    indent(out) << "output.writeListBegin(" << type_to_enum(((t_list*)ttype)->get_elem_type())
                << ", " << prefix << ".length);" << endl;
  }

  if (ttype->is_map()) {
    string kiter = tmp("kiter");
    string viter = tmp("viter");
    indent(out) << "for (" << js_let_type_ << kiter << " in " << prefix << ") {" << endl;
    indent_up();
    indent(out) << "if (" << prefix << ".hasOwnProperty(" << kiter << ")) {" << endl;
    indent_up();
    indent(out) << js_let_type_ << viter << " = " << prefix << "[" << kiter << "];" << endl;
    generate_serialize_map_element(out, (t_map*)ttype, kiter, viter);
    scope_down(out);
    scope_down(out);

  } else if (ttype->is_set()) {
    string iter = tmp("iter");
    indent(out) << "for (" << js_let_type_ << iter << " in " << prefix << ") {" << endl;
    indent_up();
    indent(out) << "if (" << prefix << ".hasOwnProperty(" << iter << ")) {" << endl;
    indent_up();
    indent(out) << iter << " = " << prefix << "[" << iter << "];" << endl;
    generate_serialize_set_element(out, (t_set*)ttype, iter);
    scope_down(out);
    scope_down(out);

  } else if (ttype->is_list()) {
    string iter = tmp("iter");
    indent(out) << "for (" << js_let_type_ << iter << " in " << prefix << ") {" << endl;
    indent_up();
    indent(out) << "if (" << prefix << ".hasOwnProperty(" << iter << ")) {" << endl;
    indent_up();
    indent(out) << iter << " = " << prefix << "[" << iter << "];" << endl;
    generate_serialize_list_element(out, (t_list*)ttype, iter);
    scope_down(out);
    scope_down(out);
  }

  if (ttype->is_map()) {
    indent(out) << "output.writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "output.writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "output.writeListEnd();" << endl;
  }
}